

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec * cram_gamma_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  cram_codec *__ptr;
  
  __ptr = (cram_codec *)malloc(0x240);
  if (__ptr != (cram_codec *)0x0) {
    __ptr->codec = E_GAMMA;
    __ptr->decode = cram_gamma_decode;
    __ptr->free = cram_gamma_decode_free;
    bVar1 = *data;
    uVar4 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar3 = (uint)bVar1;
      uVar4 = (uint)(byte)data[1];
      if (bVar1 < 0xc0) {
        uVar4 = (uVar3 & 0x3f) << 8 | uVar4;
        iVar2 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar4 = (uVar3 & 0x1f) << 0x10 | uVar4 << 8 | (uint)(byte)data[2];
        iVar2 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar4 = (uVar3 & 0xf) << 0x18 | uVar4 << 0x10 | (uint)(byte)data[2] << 8 |
                (uint)(byte)data[3];
        iVar2 = 4;
      }
      else {
        uVar4 = (byte)data[4] & 0xf |
                (uint)(byte)data[3] << 4 |
                (uint)(byte)data[2] << 0xc | uVar4 << 0x14 | uVar3 << 0x1c;
        iVar2 = 5;
      }
    }
    else {
      iVar2 = 1;
    }
    *(uint *)&__ptr->field_6 = uVar4;
    if (iVar2 == size) {
      return __ptr;
    }
    fwrite("Malformed gamma header stream\n",0x1e,1,_stderr);
    free(__ptr);
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_gamma_decode_init(char *data, int size,
				   enum cram_external_type option,
				   int version) {
    cram_codec *c;
    char *cp = data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_GAMMA;
    c->decode = cram_gamma_decode;
    c->free   = cram_gamma_decode_free;
    
    cp += itf8_get(cp, &c->gamma.offset);

    if (cp - data != size) {
	fprintf(stderr, "Malformed gamma header stream\n");
	free(c);
	return NULL;
    }

    return c;
}